

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree.c
# Opt level: O3

xrbt_t * xrbt_init(xrbt_t *tr,size_t data_size,xrbt_compare_cb compare_cb,xrbt_destroy_cb destroy_cb
                  )

{
  tr->compare_cb = compare_cb;
  tr->destroy_cb = destroy_cb;
  tr->data_size = data_size;
  tr->size = 0;
  tr->root = (xrbt_node_t *)0x0;
  return tr;
}

Assistant:

xrbt_t* xrbt_init(xrbt_t* tr, size_t data_size,
            xrbt_compare_cb compare_cb, xrbt_destroy_cb destroy_cb)
{
    tr->compare_cb  = compare_cb;
    tr->destroy_cb  = destroy_cb;
    tr->data_size   = data_size;
    tr->size        = 0;
#if XRBT_ENABLE_CACHE
    tr->cache       = NULL;
#endif
    /* no check 'tr->root' null or not */
    tr->root        = NULL;

    return tr;
}